

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Ref<embree::Geometry> *pRVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  byte bVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 (*pauVar109) [16];
  long lVar110;
  long lVar111;
  int iVar112;
  uint uVar113;
  AABBNodeMB4D *node1;
  ulong uVar114;
  long lVar115;
  ulong uVar116;
  undefined1 (*pauVar117) [16];
  undefined1 (*pauVar118) [16];
  long lVar119;
  undefined1 (*pauVar120) [16];
  ulong uVar121;
  ulong uVar122;
  ulong uVar123;
  ulong uVar124;
  uint uVar125;
  ulong uVar126;
  long lVar127;
  ulong uVar128;
  ulong uVar129;
  ulong uVar130;
  ulong uVar131;
  ulong uVar132;
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  float fVar148;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar147;
  undefined1 auVar146 [64];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar149;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  undefined1 auVar169 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar170 [16];
  undefined1 auVar174 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [64];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  float fVar185;
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  float fVar192;
  undefined1 auVar188 [32];
  float fVar190;
  float fVar191;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar189 [64];
  undefined1 auVar196 [32];
  uint uVar198;
  uint uVar199;
  uint uVar200;
  uint uVar201;
  uint uVar202;
  uint uVar203;
  undefined1 auVar197 [64];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  float fVar207;
  undefined1 auVar208 [16];
  float fVar213;
  undefined1 auVar209 [32];
  float fVar211;
  float fVar212;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar210 [64];
  undefined1 auVar217 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_28f4;
  RayQueryContext *local_28f0;
  Scene *local_28e8;
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [8];
  float fStack_2898;
  float fStack_2894;
  undefined1 local_2890 [8];
  float fStack_2888;
  float fStack_2884;
  ulong local_2880;
  long local_2878;
  ulong local_2870;
  ulong local_2868;
  ulong local_2860;
  long local_2858;
  ulong local_2850;
  ulong local_2848;
  ulong local_2840;
  ulong local_2838;
  RTCFilterFunctionNArguments local_2830;
  undefined1 local_2800 [32];
  float local_27d0;
  float local_27cc;
  float local_27c8;
  float local_27c4;
  float local_27c0;
  undefined4 local_27bc;
  uint local_27b8;
  uint local_27b4;
  uint local_27b0;
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [8];
  float fStack_2738;
  float fStack_2734;
  undefined1 local_2730 [8];
  float fStack_2728;
  float fStack_2724;
  undefined1 local_2720 [8];
  float fStack_2718;
  float fStack_2714;
  undefined1 local_2710 [8];
  float fStack_2708;
  float fStack_2704;
  undefined1 local_2700 [8];
  float fStack_26f8;
  float fStack_26f4;
  undefined1 local_26f0 [8];
  float fStack_26e8;
  float fStack_26e4;
  undefined1 local_26e0 [8];
  float fStack_26d8;
  float fStack_26d4;
  undefined1 local_26d0 [8];
  float fStack_26c8;
  float fStack_26c4;
  undefined1 local_26c0 [8];
  float fStack_26b8;
  float fStack_26b4;
  undefined1 local_26b0 [16];
  undefined1 local_26a0 [32];
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25c0 [32];
  float local_25a0 [4];
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  undefined1 local_2560 [32];
  float local_2540 [4];
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  undefined4 uStack_2524;
  float local_2520 [4];
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  undefined4 uStack_2504;
  float local_2500 [4];
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  undefined4 uStack_24e4;
  undefined1 local_24e0 [8];
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar175 [64];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_28f0 = context;
    pauVar109 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    auVar139 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3])
                         );
    aVar5 = (ray->super_RayK<1>).dir.field_0;
    fVar149 = (ray->super_RayK<1>).tfar;
    auVar146 = ZEXT464((uint)fVar149);
    auVar164._8_4_ = 0x7fffffff;
    auVar164._0_8_ = 0x7fffffff7fffffff;
    auVar164._12_4_ = 0x7fffffff;
    auVar164 = vandps_avx((undefined1  [16])aVar5,auVar164);
    auVar169._8_4_ = 0x219392ef;
    auVar169._0_8_ = 0x219392ef219392ef;
    auVar169._12_4_ = 0x219392ef;
    auVar164 = vcmpps_avx(auVar164,auVar169,1);
    auVar164 = vblendvps_avx((undefined1  [16])aVar5,auVar169,auVar164);
    auVar169 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar149));
    auVar176 = vrcpps_avx(auVar164);
    fVar149 = auVar176._0_4_;
    auVar162._0_4_ = auVar164._0_4_ * fVar149;
    fVar157 = auVar176._4_4_;
    auVar162._4_4_ = auVar164._4_4_ * fVar157;
    fVar158 = auVar176._8_4_;
    auVar162._8_4_ = auVar164._8_4_ * fVar158;
    fVar159 = auVar176._12_4_;
    auVar162._12_4_ = auVar164._12_4_ * fVar159;
    auVar176._8_4_ = 0x3f800000;
    auVar176._0_8_ = 0x3f8000003f800000;
    auVar176._12_4_ = 0x3f800000;
    auVar164 = vsubps_avx(auVar176,auVar162);
    uVar3 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23e0._4_4_ = uVar3;
    local_23e0._0_4_ = uVar3;
    local_23e0._8_4_ = uVar3;
    local_23e0._12_4_ = uVar3;
    local_23e0._16_4_ = uVar3;
    local_23e0._20_4_ = uVar3;
    local_23e0._24_4_ = uVar3;
    local_23e0._28_4_ = uVar3;
    auVar184 = ZEXT3264(local_23e0);
    uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_2400._4_4_ = uVar3;
    local_2400._0_4_ = uVar3;
    local_2400._8_4_ = uVar3;
    local_2400._12_4_ = uVar3;
    local_2400._16_4_ = uVar3;
    local_2400._20_4_ = uVar3;
    local_2400._24_4_ = uVar3;
    local_2400._28_4_ = uVar3;
    auVar189 = ZEXT3264(local_2400);
    uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2420._4_4_ = uVar3;
    local_2420._0_4_ = uVar3;
    local_2420._8_4_ = uVar3;
    local_2420._12_4_ = uVar3;
    local_2420._16_4_ = uVar3;
    local_2420._20_4_ = uVar3;
    local_2420._24_4_ = uVar3;
    local_2420._28_4_ = uVar3;
    auVar197 = ZEXT3264(local_2420);
    auVar163._0_4_ = fVar149 + fVar149 * auVar164._0_4_;
    auVar163._4_4_ = fVar157 + fVar157 * auVar164._4_4_;
    auVar163._8_4_ = fVar158 + fVar158 * auVar164._8_4_;
    auVar163._12_4_ = fVar159 + fVar159 * auVar164._12_4_;
    auVar164 = vshufps_avx(auVar163,auVar163,0);
    local_2440._16_16_ = auVar164;
    local_2440._0_16_ = auVar164;
    auVar205 = ZEXT3264(local_2440);
    auVar164 = vmovshdup_avx(auVar163);
    auVar176 = vshufps_avx(auVar163,auVar163,0x55);
    local_2460._16_16_ = auVar176;
    local_2460._0_16_ = auVar176;
    auVar206 = ZEXT3264(local_2460);
    auVar176 = vshufpd_avx(auVar163,auVar163,1);
    auVar179 = ZEXT1664(auVar176);
    auVar162 = vshufps_avx(auVar163,auVar163,0xaa);
    uVar121 = (ulong)(auVar163._0_4_ < 0.0) << 5;
    local_2480._16_16_ = auVar162;
    local_2480._0_16_ = auVar162;
    auVar210 = ZEXT3264(local_2480);
    uVar126 = (ulong)(auVar164._0_4_ < 0.0) << 5 | 0x40;
    uVar129 = (ulong)(auVar176._0_4_ < 0.0) << 5 | 0x80;
    uVar131 = uVar121 ^ 0x20;
    auVar164 = vshufps_avx(auVar139,auVar139,0);
    local_24a0._16_16_ = auVar164;
    local_24a0._0_16_ = auVar164;
    auVar182 = ZEXT3264(local_24a0);
    auVar164 = vshufps_avx(auVar169,auVar169,0);
    local_26a0._16_16_ = mm_lookupmask_ps._240_16_;
    local_26a0._0_16_ = mm_lookupmask_ps._240_16_;
    local_24c0 = vperm2f128_avx(local_26a0,mm_lookupmask_ps._0_32_,2);
    auVar168 = ZEXT3264(local_24c0);
    auVar137 = ZEXT3264(CONCAT1616(auVar164,auVar164));
    auVar152._8_4_ = 0xbf800000;
    auVar152._0_8_ = 0xbf800000bf800000;
    auVar152._12_4_ = 0xbf800000;
    auVar152._16_4_ = 0xbf800000;
    auVar152._20_4_ = 0xbf800000;
    auVar152._24_4_ = 0xbf800000;
    auVar152._28_4_ = 0xbf800000;
    auVar171._8_4_ = 0x3f800000;
    auVar171._0_8_ = 0x3f8000003f800000;
    auVar171._12_4_ = 0x3f800000;
    auVar171._16_4_ = 0x3f800000;
    auVar171._20_4_ = 0x3f800000;
    auVar171._24_4_ = 0x3f800000;
    auVar171._28_4_ = 0x3f800000;
    auVar175 = ZEXT3264(auVar171);
    _local_24e0 = vblendvps_avx(auVar171,auVar152,local_24c0);
    local_2880 = uVar121;
LAB_014d980e:
    do {
      pauVar118 = pauVar109 + -1;
      pauVar109 = pauVar109 + -1;
      if (*(float *)(*pauVar118 + 8) <= auVar146._0_4_) {
        uVar132 = *(ulong *)*pauVar109;
        while ((uVar132 & 8) == 0) {
          uVar114 = uVar132 & 0xfffffffffffffff0;
          fVar149 = (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar153._4_4_ = fVar149;
          auVar153._0_4_ = fVar149;
          auVar153._8_4_ = fVar149;
          auVar153._12_4_ = fVar149;
          auVar153._16_4_ = fVar149;
          auVar153._20_4_ = fVar149;
          auVar153._24_4_ = fVar149;
          auVar153._28_4_ = fVar149;
          pfVar2 = (float *)(uVar114 + 0x100 + uVar121);
          pfVar1 = (float *)(uVar114 + 0x40 + uVar121);
          auVar140._0_4_ = fVar149 * *pfVar2 + *pfVar1;
          auVar140._4_4_ = fVar149 * pfVar2[1] + pfVar1[1];
          auVar140._8_4_ = fVar149 * pfVar2[2] + pfVar1[2];
          auVar140._12_4_ = fVar149 * pfVar2[3] + pfVar1[3];
          auVar140._16_4_ = fVar149 * pfVar2[4] + pfVar1[4];
          auVar140._20_4_ = fVar149 * pfVar2[5] + pfVar1[5];
          auVar140._24_4_ = fVar149 * pfVar2[6] + pfVar1[6];
          auVar140._28_4_ = auVar146._28_4_ + pfVar1[7];
          auVar152 = vsubps_avx(auVar140,auVar184._0_32_);
          auVar74._4_4_ = auVar205._4_4_ * auVar152._4_4_;
          auVar74._0_4_ = auVar205._0_4_ * auVar152._0_4_;
          auVar74._8_4_ = auVar205._8_4_ * auVar152._8_4_;
          auVar74._12_4_ = auVar205._12_4_ * auVar152._12_4_;
          auVar74._16_4_ = auVar205._16_4_ * auVar152._16_4_;
          auVar74._20_4_ = auVar205._20_4_ * auVar152._20_4_;
          auVar74._24_4_ = auVar205._24_4_ * auVar152._24_4_;
          auVar74._28_4_ = auVar152._28_4_;
          auVar152 = vmaxps_avx(auVar182._0_32_,auVar74);
          pfVar2 = (float *)(uVar114 + 0x100 + uVar126);
          pfVar1 = (float *)(uVar114 + 0x40 + uVar126);
          auVar166._0_4_ = fVar149 * *pfVar2 + *pfVar1;
          auVar166._4_4_ = fVar149 * pfVar2[1] + pfVar1[1];
          auVar166._8_4_ = fVar149 * pfVar2[2] + pfVar1[2];
          auVar166._12_4_ = fVar149 * pfVar2[3] + pfVar1[3];
          auVar166._16_4_ = fVar149 * pfVar2[4] + pfVar1[4];
          auVar166._20_4_ = fVar149 * pfVar2[5] + pfVar1[5];
          auVar166._24_4_ = fVar149 * pfVar2[6] + pfVar1[6];
          auVar166._28_4_ = auVar168._28_4_ + pfVar1[7];
          auVar171 = vsubps_avx(auVar166,auVar189._0_32_);
          auVar75._4_4_ = auVar206._4_4_ * auVar171._4_4_;
          auVar75._0_4_ = auVar206._0_4_ * auVar171._0_4_;
          auVar75._8_4_ = auVar206._8_4_ * auVar171._8_4_;
          auVar75._12_4_ = auVar206._12_4_ * auVar171._12_4_;
          auVar75._16_4_ = auVar206._16_4_ * auVar171._16_4_;
          auVar75._20_4_ = auVar206._20_4_ * auVar171._20_4_;
          auVar75._24_4_ = auVar206._24_4_ * auVar171._24_4_;
          auVar75._28_4_ = auVar171._28_4_;
          pfVar2 = (float *)(uVar114 + 0x100 + uVar129);
          pfVar1 = (float *)(uVar114 + 0x40 + uVar129);
          auVar172._0_4_ = fVar149 * *pfVar2 + *pfVar1;
          auVar172._4_4_ = fVar149 * pfVar2[1] + pfVar1[1];
          auVar172._8_4_ = fVar149 * pfVar2[2] + pfVar1[2];
          auVar172._12_4_ = fVar149 * pfVar2[3] + pfVar1[3];
          auVar172._16_4_ = fVar149 * pfVar2[4] + pfVar1[4];
          auVar172._20_4_ = fVar149 * pfVar2[5] + pfVar1[5];
          auVar172._24_4_ = fVar149 * pfVar2[6] + pfVar1[6];
          auVar172._28_4_ = auVar175._28_4_ + pfVar1[7];
          auVar74 = vsubps_avx(auVar172,auVar197._0_32_);
          auVar76._4_4_ = auVar210._4_4_ * auVar74._4_4_;
          auVar76._0_4_ = auVar210._0_4_ * auVar74._0_4_;
          auVar76._8_4_ = auVar210._8_4_ * auVar74._8_4_;
          auVar76._12_4_ = auVar210._12_4_ * auVar74._12_4_;
          auVar76._16_4_ = auVar210._16_4_ * auVar74._16_4_;
          auVar76._20_4_ = auVar210._20_4_ * auVar74._20_4_;
          auVar76._24_4_ = auVar210._24_4_ * auVar74._24_4_;
          auVar76._28_4_ = auVar74._28_4_;
          auVar171 = vmaxps_avx(auVar75,auVar76);
          local_2660 = vmaxps_avx(auVar152,auVar171);
          pfVar2 = (float *)(uVar114 + 0x100 + uVar131);
          pfVar1 = (float *)(uVar114 + 0x40 + uVar131);
          auVar167._0_4_ = fVar149 * *pfVar2 + *pfVar1;
          auVar167._4_4_ = fVar149 * pfVar2[1] + pfVar1[1];
          auVar167._8_4_ = fVar149 * pfVar2[2] + pfVar1[2];
          auVar167._12_4_ = fVar149 * pfVar2[3] + pfVar1[3];
          auVar167._16_4_ = fVar149 * pfVar2[4] + pfVar1[4];
          auVar167._20_4_ = fVar149 * pfVar2[5] + pfVar1[5];
          auVar167._24_4_ = fVar149 * pfVar2[6] + pfVar1[6];
          auVar167._28_4_ = auVar171._28_4_ + pfVar1[7];
          auVar152 = vsubps_avx(auVar167,auVar184._0_32_);
          auVar77._4_4_ = auVar205._4_4_ * auVar152._4_4_;
          auVar77._0_4_ = auVar205._0_4_ * auVar152._0_4_;
          auVar77._8_4_ = auVar205._8_4_ * auVar152._8_4_;
          auVar77._12_4_ = auVar205._12_4_ * auVar152._12_4_;
          auVar77._16_4_ = auVar205._16_4_ * auVar152._16_4_;
          auVar77._20_4_ = auVar205._20_4_ * auVar152._20_4_;
          auVar77._24_4_ = auVar205._24_4_ * auVar152._24_4_;
          auVar77._28_4_ = auVar152._28_4_;
          pfVar2 = (float *)(uVar114 + 0x100 + (uVar126 ^ 0x20));
          pfVar1 = (float *)(uVar114 + 0x40 + (uVar126 ^ 0x20));
          auVar173._0_4_ = fVar149 * *pfVar2 + *pfVar1;
          auVar173._4_4_ = fVar149 * pfVar2[1] + pfVar1[1];
          auVar173._8_4_ = fVar149 * pfVar2[2] + pfVar1[2];
          auVar173._12_4_ = fVar149 * pfVar2[3] + pfVar1[3];
          auVar173._16_4_ = fVar149 * pfVar2[4] + pfVar1[4];
          auVar173._20_4_ = fVar149 * pfVar2[5] + pfVar1[5];
          auVar173._24_4_ = fVar149 * pfVar2[6] + pfVar1[6];
          auVar173._28_4_ = auVar74._28_4_ + pfVar1[7];
          auVar152 = vsubps_avx(auVar173,auVar189._0_32_);
          auVar78._4_4_ = auVar206._4_4_ * auVar152._4_4_;
          auVar78._0_4_ = auVar206._0_4_ * auVar152._0_4_;
          auVar78._8_4_ = auVar206._8_4_ * auVar152._8_4_;
          auVar78._12_4_ = auVar206._12_4_ * auVar152._12_4_;
          auVar78._16_4_ = auVar206._16_4_ * auVar152._16_4_;
          auVar78._20_4_ = auVar206._20_4_ * auVar152._20_4_;
          auVar78._24_4_ = auVar206._24_4_ * auVar152._24_4_;
          auVar78._28_4_ = auVar152._28_4_;
          pfVar2 = (float *)(uVar114 + 0x100 + (uVar129 ^ 0x20));
          pfVar1 = (float *)(uVar114 + 0x40 + (uVar129 ^ 0x20));
          auVar177._0_4_ = fVar149 * *pfVar2 + *pfVar1;
          auVar177._4_4_ = fVar149 * pfVar2[1] + pfVar1[1];
          auVar177._8_4_ = fVar149 * pfVar2[2] + pfVar1[2];
          auVar177._12_4_ = fVar149 * pfVar2[3] + pfVar1[3];
          auVar177._16_4_ = fVar149 * pfVar2[4] + pfVar1[4];
          auVar177._20_4_ = fVar149 * pfVar2[5] + pfVar1[5];
          auVar177._24_4_ = fVar149 * pfVar2[6] + pfVar1[6];
          auVar177._28_4_ = auVar179._28_4_ + pfVar1[7];
          auVar152 = vsubps_avx(auVar177,auVar197._0_32_);
          auVar82._4_4_ = auVar210._4_4_ * auVar152._4_4_;
          auVar82._0_4_ = auVar210._0_4_ * auVar152._0_4_;
          auVar82._8_4_ = auVar210._8_4_ * auVar152._8_4_;
          auVar82._12_4_ = auVar210._12_4_ * auVar152._12_4_;
          auVar82._16_4_ = auVar210._16_4_ * auVar152._16_4_;
          auVar82._20_4_ = auVar210._20_4_ * auVar152._20_4_;
          auVar82._24_4_ = auVar210._24_4_ * auVar152._24_4_;
          auVar82._28_4_ = auVar152._28_4_;
          auVar179 = ZEXT3264(auVar82);
          auVar171 = vminps_avx(auVar78,auVar82);
          auVar152 = vminps_avx(auVar137._0_32_,auVar77);
          auVar152 = vminps_avx(auVar152,auVar171);
          auVar152 = vcmpps_avx(local_2660,auVar152,2);
          if (((uint)uVar132 & 7) == 6) {
            auVar171 = vcmpps_avx(*(undefined1 (*) [32])(uVar114 + 0x1c0),auVar153,2);
            auVar74 = vcmpps_avx(auVar153,*(undefined1 (*) [32])(uVar114 + 0x1e0),1);
            auVar74 = vandps_avx(auVar171,auVar74);
            auVar152 = vandps_avx(auVar74,auVar152);
            auVar164 = vpackssdw_avx(auVar152._0_16_,auVar152._16_16_);
          }
          else {
            auVar164 = vpackssdw_avx(auVar152._0_16_,auVar152._16_16_);
          }
          auVar175 = ZEXT3264(auVar171);
          auVar164 = vpsllw_avx(auVar164,0xf);
          auVar168 = ZEXT1664(auVar164);
          if ((((((((auVar164 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar164 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar164 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar164 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar164 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar164 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar164 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar164[0xf]) {
            auVar164 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                              ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar146 = ZEXT1664(auVar164);
            if (pauVar109 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            goto LAB_014d980e;
          }
          auVar164 = vpacksswb_avx(auVar164,auVar164);
          auVar146 = ZEXT1664(auVar164);
          bVar81 = SUB161(auVar164 >> 7,0) & 1 | (SUB161(auVar164 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar164 >> 0x17,0) & 1) << 2 | (SUB161(auVar164 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar164 >> 0x27,0) & 1) << 4 | (SUB161(auVar164 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar164 >> 0x37,0) & 1) << 6 | SUB161(auVar164 >> 0x3f,0) << 7;
          lVar111 = 0;
          if (bVar81 != 0) {
            for (; (bVar81 >> lVar111 & 1) == 0; lVar111 = lVar111 + 1) {
            }
          }
          uVar132 = *(ulong *)(uVar114 + lVar111 * 8);
          uVar125 = bVar81 - 1 & (uint)bVar81;
          if (uVar125 != 0) {
            uVar198 = *(uint *)(local_2660 + lVar111 * 4);
            lVar111 = 0;
            if (uVar125 != 0) {
              for (; (uVar125 >> lVar111 & 1) == 0; lVar111 = lVar111 + 1) {
              }
            }
            uVar116 = *(ulong *)(uVar114 + lVar111 * 8);
            uVar113 = *(uint *)(local_2660 + lVar111 * 4);
            uVar125 = uVar125 - 1 & uVar125;
            if (uVar125 == 0) {
              if (uVar198 < uVar113) {
                *(ulong *)*pauVar109 = uVar116;
                *(uint *)(*pauVar109 + 8) = uVar113;
                pauVar109 = pauVar109 + 1;
              }
              else {
                *(ulong *)*pauVar109 = uVar132;
                *(uint *)(*pauVar109 + 8) = uVar198;
                pauVar109 = pauVar109 + 1;
                uVar132 = uVar116;
              }
            }
            else {
              auVar139._8_8_ = 0;
              auVar139._0_8_ = uVar132;
              auVar164 = vpunpcklqdq_avx(auVar139,ZEXT416(uVar198));
              auVar150._8_8_ = 0;
              auVar150._0_8_ = uVar116;
              auVar139 = vpunpcklqdq_avx(auVar150,ZEXT416(uVar113));
              lVar111 = 0;
              if (uVar125 != 0) {
                for (; (uVar125 >> lVar111 & 1) == 0; lVar111 = lVar111 + 1) {
                }
              }
              auVar165._8_8_ = 0;
              auVar165._0_8_ = *(ulong *)(uVar114 + lVar111 * 8);
              auVar169 = vpunpcklqdq_avx(auVar165,ZEXT416(*(uint *)(local_2660 + lVar111 * 4)));
              auVar168 = ZEXT1664(auVar169);
              uVar125 = uVar125 - 1 & uVar125;
              if (uVar125 == 0) {
                auVar176 = vpcmpgtd_avx(auVar139,auVar164);
                auVar162 = vpshufd_avx(auVar176,0xaa);
                auVar176 = vblendvps_avx(auVar139,auVar164,auVar162);
                auVar164 = vblendvps_avx(auVar164,auVar139,auVar162);
                auVar139 = vpcmpgtd_avx(auVar169,auVar176);
                auVar162 = vpshufd_avx(auVar139,0xaa);
                auVar139 = vblendvps_avx(auVar169,auVar176,auVar162);
                auVar175 = ZEXT1664(auVar139);
                auVar169 = vblendvps_avx(auVar176,auVar169,auVar162);
                auVar176 = vpcmpgtd_avx(auVar169,auVar164);
                auVar162 = vpshufd_avx(auVar176,0xaa);
                auVar168 = ZEXT1664(auVar162);
                auVar176 = vblendvps_avx(auVar169,auVar164,auVar162);
                auVar179 = ZEXT1664(auVar176);
                auVar164 = vblendvps_avx(auVar164,auVar169,auVar162);
                auVar146 = ZEXT1664(auVar164);
                *pauVar109 = auVar164;
                pauVar109[1] = auVar176;
                uVar132 = auVar139._0_8_;
                pauVar109 = pauVar109 + 2;
              }
              else {
                lVar111 = 0;
                if (uVar125 != 0) {
                  for (; (uVar125 >> lVar111 & 1) == 0; lVar111 = lVar111 + 1) {
                  }
                }
                auVar179 = ZEXT464(*(uint *)(local_2660 + lVar111 * 4));
                auVar170._8_8_ = 0;
                auVar170._0_8_ = *(ulong *)(uVar114 + lVar111 * 8);
                auVar176 = vpunpcklqdq_avx(auVar170,ZEXT416(*(uint *)(local_2660 + lVar111 * 4)));
                auVar175 = ZEXT1664(auVar176);
                uVar125 = uVar125 - 1 & uVar125;
                uVar116 = (ulong)uVar125;
                if (uVar125 == 0) {
                  auVar162 = vpcmpgtd_avx(auVar139,auVar164);
                  auVar163 = vpshufd_avx(auVar162,0xaa);
                  auVar162 = vblendvps_avx(auVar139,auVar164,auVar163);
                  auVar164 = vblendvps_avx(auVar164,auVar139,auVar163);
                  auVar139 = vpcmpgtd_avx(auVar176,auVar169);
                  auVar163 = vpshufd_avx(auVar139,0xaa);
                  auVar139 = vblendvps_avx(auVar176,auVar169,auVar163);
                  auVar169 = vblendvps_avx(auVar169,auVar176,auVar163);
                  auVar176 = vpcmpgtd_avx(auVar169,auVar164);
                  auVar163 = vpshufd_avx(auVar176,0xaa);
                  auVar176 = vblendvps_avx(auVar169,auVar164,auVar163);
                  auVar175 = ZEXT1664(auVar176);
                  auVar164 = vblendvps_avx(auVar164,auVar169,auVar163);
                  auVar146 = ZEXT1664(auVar164);
                  auVar169 = vpcmpgtd_avx(auVar139,auVar162);
                  auVar163 = vpshufd_avx(auVar169,0xaa);
                  auVar169 = vblendvps_avx(auVar139,auVar162,auVar163);
                  auVar168 = ZEXT1664(auVar169);
                  auVar139 = vblendvps_avx(auVar162,auVar139,auVar163);
                  auVar162 = vpcmpgtd_avx(auVar176,auVar139);
                  auVar163 = vpshufd_avx(auVar162,0xaa);
                  auVar179 = ZEXT1664(auVar163);
                  auVar162 = vblendvps_avx(auVar176,auVar139,auVar163);
                  auVar139 = vblendvps_avx(auVar139,auVar176,auVar163);
                  *pauVar109 = auVar164;
                  pauVar109[1] = auVar139;
                  pauVar109[2] = auVar162;
                  uVar132 = auVar169._0_8_;
                  pauVar118 = pauVar109 + 3;
                }
                else {
                  *pauVar109 = auVar164;
                  pauVar109[1] = auVar139;
                  pauVar109[2] = auVar169;
                  pauVar109[3] = auVar176;
                  lVar111 = 0x30;
                  do {
                    lVar119 = lVar111;
                    lVar111 = 0;
                    if (uVar116 != 0) {
                      for (; (uVar116 >> lVar111 & 1) == 0; lVar111 = lVar111 + 1) {
                      }
                    }
                    uVar132 = *(ulong *)(uVar114 + lVar111 * 8);
                    auVar138._8_8_ = 0;
                    auVar138._0_8_ = uVar132;
                    auVar164 = vpunpcklqdq_avx(auVar138,ZEXT416(*(uint *)(local_2660 + lVar111 * 4))
                                              );
                    auVar146 = ZEXT1664(auVar164);
                    *(undefined1 (*) [16])(pauVar109[1] + lVar119) = auVar164;
                    uVar116 = uVar116 & uVar116 - 1;
                    lVar111 = lVar119 + 0x10;
                  } while (uVar116 != 0);
                  pauVar118 = (undefined1 (*) [16])(pauVar109[1] + lVar119);
                  if (lVar119 + 0x10 != 0) {
                    lVar111 = 0x10;
                    pauVar117 = pauVar109;
                    do {
                      auVar164 = pauVar117[1];
                      auVar146 = ZEXT1664(auVar164);
                      pauVar117 = pauVar117 + 1;
                      uVar125 = vextractps_avx(auVar164,2);
                      lVar119 = lVar111;
                      do {
                        if (uVar125 <= *(uint *)(pauVar109[-1] + lVar119 + 8)) {
                          pauVar120 = (undefined1 (*) [16])(*pauVar109 + lVar119);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar109 + lVar119) =
                             *(undefined1 (*) [16])(pauVar109[-1] + lVar119);
                        lVar119 = lVar119 + -0x10;
                        pauVar120 = pauVar109;
                      } while (lVar119 != 0);
                      *pauVar120 = auVar164;
                      lVar111 = lVar111 + 0x10;
                    } while (pauVar118 != pauVar117);
                    uVar132 = *(ulong *)*pauVar118;
                  }
                }
                auVar182 = ZEXT3264(auVar182._0_32_);
                pauVar109 = pauVar118;
              }
            }
          }
        }
        local_2878 = (ulong)((uint)uVar132 & 0xf) - 8;
        if (local_2878 != 0) {
          uVar132 = uVar132 & 0xfffffffffffffff0;
          local_28e8 = local_28f0->scene;
          lVar111 = 0;
          do {
            lVar110 = lVar111 * 0x60;
            pRVar6 = (local_28e8->geometries).items;
            pGVar7 = pRVar6[*(uint *)(uVar132 + 0x40 + lVar110)].ptr;
            fVar149 = (pGVar7->time_range).lower;
            fVar149 = pGVar7->fnumTimeSegments *
                      (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar149) /
                      ((pGVar7->time_range).upper - fVar149));
            auVar164 = vroundss_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149),9);
            auVar164 = vminss_avx(auVar164,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
            auVar208 = vmaxss_avx(ZEXT816(0) << 0x20,auVar164);
            iVar112 = (int)auVar208._0_4_;
            lVar127 = (long)iVar112 * 0x38;
            lVar119 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar127);
            local_2848 = (ulong)*(uint *)(uVar132 + 4 + lVar110);
            auVar164 = *(undefined1 (*) [16])(lVar119 + (ulong)*(uint *)(uVar132 + lVar110) * 4);
            uVar121 = (ulong)*(uint *)(uVar132 + 0x10 + lVar110);
            auVar139 = *(undefined1 (*) [16])(lVar119 + uVar121 * 4);
            uVar114 = (ulong)*(uint *)(uVar132 + 0x20 + lVar110);
            auVar169 = *(undefined1 (*) [16])(lVar119 + uVar114 * 4);
            uVar116 = (ulong)*(uint *)(uVar132 + 0x30 + lVar110);
            auVar176 = *(undefined1 (*) [16])(lVar119 + uVar116 * 4);
            local_2858 = *(long *)&pRVar6[*(uint *)(uVar132 + 0x44 + lVar110)].ptr[2].numPrimitives;
            lVar119 = *(long *)(local_2858 + lVar127);
            auVar162 = *(undefined1 (*) [16])(lVar119 + local_2848 * 4);
            local_2838 = (ulong)*(uint *)(uVar132 + 0x14 + lVar110);
            auVar163 = *(undefined1 (*) [16])(lVar119 + local_2838 * 4);
            uVar122 = (ulong)*(uint *)(uVar132 + 0x24 + lVar110);
            auVar150 = *(undefined1 (*) [16])(lVar119 + uVar122 * 4);
            uVar123 = (ulong)*(uint *)(uVar132 + 0x34 + lVar110);
            auVar165 = *(undefined1 (*) [16])(lVar119 + uVar123 * 4);
            lVar119 = *(long *)&pRVar6[*(uint *)(uVar132 + 0x48 + lVar110)].ptr[2].numPrimitives;
            lVar8 = *(long *)(lVar119 + lVar127);
            uVar124 = (ulong)*(uint *)(uVar132 + 8 + lVar110);
            auVar170 = *(undefined1 (*) [16])(lVar8 + uVar124 * 4);
            local_2860 = (ulong)*(uint *)(uVar132 + 0x18 + lVar110);
            auVar138 = *(undefined1 (*) [16])(lVar8 + local_2860 * 4);
            local_2850 = (ulong)*(uint *)(uVar132 + 0x28 + lVar110);
            auVar133 = *(undefined1 (*) [16])(lVar8 + local_2850 * 4);
            local_2840 = (ulong)*(uint *)(uVar132 + 0x38 + lVar110);
            auVar151 = *(undefined1 (*) [16])(lVar8 + local_2840 * 4);
            fVar149 = fVar149 - auVar208._0_4_;
            local_26b0 = ZEXT416((uint)fVar149);
            lVar8 = *(long *)&pRVar6[*(uint *)(uVar132 + 0x4c + lVar110)].ptr[2].numPrimitives;
            lVar127 = *(long *)(lVar8 + lVar127);
            uVar128 = (ulong)*(uint *)(uVar132 + 0xc + lVar110);
            auVar208 = *(undefined1 (*) [16])(lVar127 + uVar128 * 4);
            local_2870 = (ulong)*(uint *)(uVar132 + 0x1c + lVar110);
            auVar220 = *(undefined1 (*) [16])(lVar127 + local_2870 * 4);
            auVar186 = vunpcklps_avx(auVar164,auVar170);
            auVar170 = vunpckhps_avx(auVar164,auVar170);
            auVar79 = vunpcklps_avx(auVar162,auVar208);
            auVar162 = vunpckhps_avx(auVar162,auVar208);
            uVar130 = (ulong)*(uint *)(uVar132 + 0x2c + lVar110);
            auVar164 = *(undefined1 (*) [16])(lVar127 + uVar130 * 4);
            _local_26d0 = vunpcklps_avx(auVar170,auVar162);
            auVar107 = _local_26d0;
            _local_2710 = vunpcklps_avx(auVar186,auVar79);
            auVar103 = _local_2710;
            _local_26f0 = vunpckhps_avx(auVar186,auVar79);
            auVar105 = _local_26f0;
            auVar170 = vunpcklps_avx(auVar139,auVar138);
            auVar162 = vunpckhps_avx(auVar139,auVar138);
            auVar138 = vunpcklps_avx(auVar163,auVar220);
            auVar163 = vunpckhps_avx(auVar163,auVar220);
            local_2868 = (ulong)*(uint *)(uVar132 + 0x3c + lVar110);
            auVar139 = *(undefined1 (*) [16])(lVar127 + local_2868 * 4);
            _local_26c0 = vunpcklps_avx(auVar162,auVar163);
            auVar108 = _local_26c0;
            _local_2700 = vunpcklps_avx(auVar170,auVar138);
            auVar104 = _local_2700;
            _local_26e0 = vunpckhps_avx(auVar170,auVar138);
            auVar106 = _local_26e0;
            auVar163 = vunpcklps_avx(auVar169,auVar133);
            auVar169 = vunpckhps_avx(auVar169,auVar133);
            auVar170 = vunpcklps_avx(auVar150,auVar164);
            auVar162 = vunpckhps_avx(auVar150,auVar164);
            lVar115 = (long)(iVar112 + 1) * 0x38;
            lVar127 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar115);
            auVar164 = *(undefined1 (*) [16])(lVar127 + (ulong)*(uint *)(uVar132 + lVar110) * 4);
            _local_2890 = vunpcklps_avx(auVar169,auVar162);
            auVar99 = _local_2890;
            _local_2740 = vunpcklps_avx(auVar163,auVar170);
            auVar100 = _local_2740;
            _local_2720 = vunpckhps_avx(auVar163,auVar170);
            auVar102 = _local_2720;
            auVar162 = vunpcklps_avx(auVar176,auVar151);
            auVar169 = vunpckhps_avx(auVar176,auVar151);
            auVar163 = vunpcklps_avx(auVar165,auVar139);
            auVar176 = vunpckhps_avx(auVar165,auVar139);
            lVar119 = *(long *)(lVar119 + lVar115);
            auVar139 = *(undefined1 (*) [16])(lVar119 + uVar124 * 4);
            _local_28a0 = vunpcklps_avx(auVar169,auVar176);
            auVar98 = _local_28a0;
            auVar150 = vunpcklps_avx(auVar162,auVar163);
            _local_2730 = vunpckhps_avx(auVar162,auVar163);
            auVar101 = _local_2730;
            lVar9 = *(long *)(local_2858 + lVar115);
            auVar176 = vunpcklps_avx(auVar164,auVar139);
            auVar169 = vunpckhps_avx(auVar164,auVar139);
            auVar164 = *(undefined1 (*) [16])(lVar9 + local_2848 * 4);
            lVar8 = *(long *)(lVar8 + lVar115);
            auVar139 = *(undefined1 (*) [16])(lVar8 + uVar128 * 4);
            auVar162 = vunpcklps_avx(auVar164,auVar139);
            auVar164 = vunpckhps_avx(auVar164,auVar139);
            auVar165 = vunpcklps_avx(auVar169,auVar164);
            auVar170 = vunpcklps_avx(auVar176,auVar162);
            auVar169 = vunpckhps_avx(auVar176,auVar162);
            auVar164 = *(undefined1 (*) [16])(lVar127 + uVar121 * 4);
            auVar139 = *(undefined1 (*) [16])(lVar119 + local_2860 * 4);
            auVar162 = vunpcklps_avx(auVar164,auVar139);
            auVar176 = vunpckhps_avx(auVar164,auVar139);
            auVar164 = *(undefined1 (*) [16])(lVar9 + local_2838 * 4);
            auVar139 = *(undefined1 (*) [16])(lVar8 + local_2870 * 4);
            auVar163 = vunpcklps_avx(auVar164,auVar139);
            auVar164 = vunpckhps_avx(auVar164,auVar139);
            auVar138 = vunpcklps_avx(auVar176,auVar164);
            auVar133 = vunpcklps_avx(auVar162,auVar163);
            auVar176 = vunpckhps_avx(auVar162,auVar163);
            auVar164 = *(undefined1 (*) [16])(lVar127 + uVar114 * 4);
            auVar139 = *(undefined1 (*) [16])(lVar119 + local_2850 * 4);
            auVar163 = vunpcklps_avx(auVar164,auVar139);
            auVar162 = vunpckhps_avx(auVar164,auVar139);
            auVar164 = *(undefined1 (*) [16])(lVar9 + uVar122 * 4);
            auVar139 = *(undefined1 (*) [16])(lVar8 + uVar130 * 4);
            auVar151 = vunpcklps_avx(auVar164,auVar139);
            auVar164 = vunpckhps_avx(auVar164,auVar139);
            auVar208 = vunpcklps_avx(auVar162,auVar164);
            auVar220 = vunpcklps_avx(auVar163,auVar151);
            auVar162 = vunpckhps_avx(auVar163,auVar151);
            auVar164 = *(undefined1 (*) [16])(lVar127 + uVar116 * 4);
            auVar139 = *(undefined1 (*) [16])(lVar119 + local_2840 * 4);
            auVar151 = vunpcklps_avx(auVar164,auVar139);
            auVar163 = vunpckhps_avx(auVar164,auVar139);
            auVar164 = *(undefined1 (*) [16])(lVar9 + uVar123 * 4);
            auVar139 = *(undefined1 (*) [16])(lVar8 + local_2868 * 4);
            auVar186 = vunpcklps_avx(auVar164,auVar139);
            auVar164 = vunpckhps_avx(auVar164,auVar139);
            auVar79 = vunpcklps_avx(auVar163,auVar164);
            auVar80 = vunpcklps_avx(auVar151,auVar186);
            auVar163 = vunpckhps_avx(auVar151,auVar186);
            auVar164 = vshufps_avx(local_26b0,local_26b0,0);
            auVar139 = ZEXT416((uint)(1.0 - fVar149));
            auVar139 = vshufps_avx(auVar139,auVar139,0);
            fVar149 = auVar164._0_4_;
            fVar157 = auVar164._4_4_;
            fVar158 = auVar164._8_4_;
            fVar159 = auVar164._12_4_;
            fVar160 = auVar139._0_4_;
            fVar161 = auVar139._4_4_;
            fVar147 = auVar139._8_4_;
            fVar148 = auVar139._12_4_;
            auVar174._4_4_ = fVar161 * (float)local_2710._4_4_ + auVar170._4_4_ * fVar157;
            auVar174._0_4_ = fVar160 * (float)local_2710._0_4_ + auVar170._0_4_ * fVar149;
            auVar174._8_4_ = fVar147 * fStack_2708 + auVar170._8_4_ * fVar158;
            auVar174._12_4_ = fVar148 * fStack_2704 + auVar170._12_4_ * fVar159;
            auVar178._4_4_ = fVar161 * (float)local_26f0._4_4_ + auVar169._4_4_ * fVar157;
            auVar178._0_4_ = fVar160 * (float)local_26f0._0_4_ + auVar169._0_4_ * fVar149;
            auVar178._8_4_ = fVar147 * fStack_26e8 + auVar169._8_4_ * fVar158;
            auVar178._12_4_ = fVar148 * fStack_26e4 + auVar169._12_4_ * fVar159;
            auVar183._4_4_ = fVar161 * (float)local_26d0._4_4_ + auVar165._4_4_ * fVar157;
            auVar183._0_4_ = fVar160 * (float)local_26d0._0_4_ + auVar165._0_4_ * fVar149;
            auVar183._8_4_ = fVar147 * fStack_26c8 + auVar165._8_4_ * fVar158;
            auVar183._12_4_ = fVar148 * fStack_26c4 + auVar165._12_4_ * fVar159;
            auVar186._0_4_ = fVar160 * (float)local_2700._0_4_ + fVar149 * auVar133._0_4_;
            auVar186._4_4_ = fVar161 * (float)local_2700._4_4_ + fVar157 * auVar133._4_4_;
            auVar186._8_4_ = fVar147 * fStack_26f8 + fVar158 * auVar133._8_4_;
            auVar186._12_4_ = fVar148 * fStack_26f4 + fVar159 * auVar133._12_4_;
            auVar151._0_4_ = fVar160 * (float)local_26e0._0_4_ + fVar149 * auVar176._0_4_;
            auVar151._4_4_ = fVar161 * (float)local_26e0._4_4_ + fVar157 * auVar176._4_4_;
            auVar151._8_4_ = fVar147 * fStack_26d8 + fVar158 * auVar176._8_4_;
            auVar151._12_4_ = fVar148 * fStack_26d4 + fVar159 * auVar176._12_4_;
            auVar218._0_4_ = fVar160 * (float)local_26c0._0_4_ + auVar138._0_4_ * fVar149;
            auVar218._4_4_ = fVar161 * (float)local_26c0._4_4_ + auVar138._4_4_ * fVar157;
            auVar218._8_4_ = fVar147 * fStack_26b8 + auVar138._8_4_ * fVar158;
            auVar218._12_4_ = fVar148 * fStack_26b4 + auVar138._12_4_ * fVar159;
            auVar174._20_4_ = fVar161 * (float)local_2740._4_4_ + fVar157 * auVar220._4_4_;
            auVar174._16_4_ = fVar160 * (float)local_2740._0_4_ + fVar149 * auVar220._0_4_;
            auVar174._24_4_ = fVar147 * fStack_2738 + fVar158 * auVar220._8_4_;
            auVar174._28_4_ = fVar148 * fStack_2734 + fVar159 * auVar220._12_4_;
            auVar178._20_4_ = fVar161 * (float)local_2720._4_4_ + auVar162._4_4_ * fVar157;
            auVar178._16_4_ = fVar160 * (float)local_2720._0_4_ + auVar162._0_4_ * fVar149;
            auVar178._24_4_ = fVar147 * fStack_2718 + auVar162._8_4_ * fVar158;
            auVar178._28_4_ = fVar148 * fStack_2714 + auVar162._12_4_ * fVar159;
            auVar183._20_4_ = fVar161 * (float)local_2890._4_4_ + auVar208._4_4_ * fVar157;
            auVar183._16_4_ = fVar160 * (float)local_2890._0_4_ + auVar208._0_4_ * fVar149;
            auVar183._24_4_ = fVar147 * fStack_2888 + auVar208._8_4_ * fVar158;
            auVar183._28_4_ = fVar148 * fStack_2884 + auVar208._12_4_ * fVar159;
            auVar220._0_4_ = auVar150._0_4_ * fVar160 + fVar149 * auVar80._0_4_;
            auVar220._4_4_ = auVar150._4_4_ * fVar161 + fVar157 * auVar80._4_4_;
            auVar220._8_4_ = auVar150._8_4_ * fVar147 + fVar158 * auVar80._8_4_;
            auVar220._12_4_ = auVar150._12_4_ * fVar148 + fVar159 * auVar80._12_4_;
            lVar119 = uVar132 + 0x40 + lVar110;
            local_23c0 = *(undefined8 *)(lVar119 + 0x10);
            uStack_23b8 = *(undefined8 *)(lVar119 + 0x18);
            uStack_23b0 = local_23c0;
            uStack_23a8 = uStack_23b8;
            lVar110 = uVar132 + 0x50 + lVar110;
            local_2680 = *(undefined8 *)(lVar110 + 0x10);
            uStack_2678 = *(undefined8 *)(lVar110 + 0x18);
            auVar208._0_4_ = fVar160 * (float)local_2730._0_4_ + fVar149 * auVar163._0_4_;
            auVar208._4_4_ = fVar161 * (float)local_2730._4_4_ + fVar157 * auVar163._4_4_;
            auVar208._8_4_ = fVar147 * fStack_2728 + fVar158 * auVar163._8_4_;
            auVar208._12_4_ = fVar148 * fStack_2724 + fVar159 * auVar163._12_4_;
            auVar133._0_4_ = fVar160 * (float)local_28a0._0_4_ + fVar149 * auVar79._0_4_;
            auVar133._4_4_ = fVar161 * (float)local_28a0._4_4_ + fVar157 * auVar79._4_4_;
            auVar133._8_4_ = fVar147 * fStack_2898 + fVar158 * auVar79._8_4_;
            auVar133._12_4_ = fVar148 * fStack_2894 + fVar159 * auVar79._12_4_;
            uStack_2670 = local_2680;
            uStack_2668 = uStack_2678;
            auVar141._16_16_ = auVar186;
            auVar141._0_16_ = auVar186;
            auVar154._16_16_ = auVar151;
            auVar154._0_16_ = auVar151;
            auVar187._16_16_ = auVar218;
            auVar187._0_16_ = auVar218;
            auVar196._16_16_ = auVar220;
            auVar196._0_16_ = auVar220;
            auVar204._16_16_ = auVar208;
            auVar204._0_16_ = auVar208;
            auVar134._16_16_ = auVar133;
            auVar134._0_16_ = auVar133;
            local_28c0 = vsubps_avx(auVar174,auVar141);
            local_2780 = vsubps_avx(auVar178,auVar154);
            auVar152 = vsubps_avx(auVar183,auVar187);
            auVar171 = vsubps_avx(auVar196,auVar174);
            auVar74 = vsubps_avx(auVar204,auVar178);
            auVar75 = vsubps_avx(auVar134,auVar183);
            fVar159 = auVar75._0_4_;
            fVar207 = local_2780._0_4_;
            fVar14 = auVar75._4_4_;
            fVar211 = local_2780._4_4_;
            auVar83._4_4_ = fVar211 * fVar14;
            auVar83._0_4_ = fVar207 * fVar159;
            fVar24 = auVar75._8_4_;
            fVar212 = local_2780._8_4_;
            auVar83._8_4_ = fVar212 * fVar24;
            fVar34 = auVar75._12_4_;
            fVar213 = local_2780._12_4_;
            auVar83._12_4_ = fVar213 * fVar34;
            fVar44 = auVar75._16_4_;
            fVar214 = local_2780._16_4_;
            auVar83._16_4_ = fVar214 * fVar44;
            fVar54 = auVar75._20_4_;
            fVar215 = local_2780._20_4_;
            auVar83._20_4_ = fVar215 * fVar54;
            fVar64 = auVar75._24_4_;
            fVar216 = local_2780._24_4_;
            auVar83._24_4_ = fVar216 * fVar64;
            auVar83._28_4_ = auVar133._12_4_;
            fVar160 = auVar74._0_4_;
            fVar185 = auVar152._0_4_;
            fVar15 = auVar74._4_4_;
            fVar190 = auVar152._4_4_;
            auVar84._4_4_ = fVar190 * fVar15;
            auVar84._0_4_ = fVar185 * fVar160;
            fVar25 = auVar74._8_4_;
            fVar191 = auVar152._8_4_;
            auVar84._8_4_ = fVar191 * fVar25;
            fVar35 = auVar74._12_4_;
            fVar192 = auVar152._12_4_;
            auVar84._12_4_ = fVar192 * fVar35;
            fVar45 = auVar74._16_4_;
            fVar193 = auVar152._16_4_;
            auVar84._16_4_ = fVar193 * fVar45;
            fVar55 = auVar74._20_4_;
            fVar194 = auVar152._20_4_;
            auVar84._20_4_ = fVar194 * fVar55;
            fVar65 = auVar74._24_4_;
            fVar195 = auVar152._24_4_;
            auVar84._24_4_ = fVar195 * fVar65;
            auVar84._28_4_ = auVar186._12_4_;
            local_2800 = vsubps_avx(auVar84,auVar83);
            fVar161 = auVar171._0_4_;
            fVar16 = auVar171._4_4_;
            auVar85._4_4_ = fVar190 * fVar16;
            auVar85._0_4_ = fVar185 * fVar161;
            fVar26 = auVar171._8_4_;
            auVar85._8_4_ = fVar191 * fVar26;
            fVar36 = auVar171._12_4_;
            auVar85._12_4_ = fVar192 * fVar36;
            fVar46 = auVar171._16_4_;
            auVar85._16_4_ = fVar193 * fVar46;
            fVar56 = auVar171._20_4_;
            auVar85._20_4_ = fVar194 * fVar56;
            fVar66 = auVar171._24_4_;
            auVar85._24_4_ = fVar195 * fVar66;
            auVar85._28_4_ = auVar186._12_4_;
            fVar147 = local_28c0._0_4_;
            fVar17 = local_28c0._4_4_;
            auVar86._4_4_ = fVar14 * fVar17;
            auVar86._0_4_ = fVar159 * fVar147;
            fVar27 = local_28c0._8_4_;
            auVar86._8_4_ = fVar24 * fVar27;
            fVar37 = local_28c0._12_4_;
            auVar86._12_4_ = fVar34 * fVar37;
            fVar47 = local_28c0._16_4_;
            auVar86._16_4_ = fVar44 * fVar47;
            fVar57 = local_28c0._20_4_;
            auVar86._20_4_ = fVar54 * fVar57;
            fVar67 = local_28c0._24_4_;
            auVar86._24_4_ = fVar64 * fVar67;
            auVar86._28_4_ = auVar151._12_4_;
            auVar152 = vsubps_avx(auVar86,auVar85);
            auVar87._4_4_ = fVar15 * fVar17;
            auVar87._0_4_ = fVar160 * fVar147;
            auVar87._8_4_ = fVar25 * fVar27;
            auVar87._12_4_ = fVar35 * fVar37;
            auVar87._16_4_ = fVar45 * fVar47;
            auVar87._20_4_ = fVar55 * fVar57;
            auVar87._24_4_ = fVar65 * fVar67;
            auVar87._28_4_ = auVar151._12_4_;
            auVar88._4_4_ = fVar211 * fVar16;
            auVar88._0_4_ = fVar207 * fVar161;
            auVar88._8_4_ = fVar212 * fVar26;
            auVar88._12_4_ = fVar213 * fVar36;
            auVar88._16_4_ = fVar214 * fVar46;
            auVar88._20_4_ = fVar215 * fVar56;
            auVar88._24_4_ = fVar216 * fVar66;
            auVar88._28_4_ = local_2780._28_4_;
            local_28e0 = vsubps_avx(auVar88,auVar87);
            uVar3 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar209._4_4_ = uVar3;
            auVar209._0_4_ = uVar3;
            auVar209._8_4_ = uVar3;
            auVar209._12_4_ = uVar3;
            auVar209._16_4_ = uVar3;
            auVar209._20_4_ = uVar3;
            auVar209._24_4_ = uVar3;
            auVar209._28_4_ = uVar3;
            uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar217._4_4_ = uVar3;
            auVar217._0_4_ = uVar3;
            auVar217._8_4_ = uVar3;
            auVar217._12_4_ = uVar3;
            auVar217._16_4_ = uVar3;
            auVar217._20_4_ = uVar3;
            auVar217._24_4_ = uVar3;
            auVar217._28_4_ = uVar3;
            uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar219._4_4_ = uVar4;
            auVar219._0_4_ = uVar4;
            auVar219._8_4_ = uVar4;
            auVar219._12_4_ = uVar4;
            auVar219._16_4_ = uVar4;
            auVar219._20_4_ = uVar4;
            auVar219._24_4_ = uVar4;
            auVar219._28_4_ = uVar4;
            fVar149 = (ray->super_RayK<1>).dir.field_0.m128[1];
            local_27a0 = vsubps_avx(auVar174,auVar209);
            fVar157 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar76 = vsubps_avx(auVar178,auVar217);
            auVar179 = ZEXT3264(auVar76);
            auVar77 = vsubps_avx(auVar183,auVar219);
            fVar148 = auVar77._0_4_;
            fVar18 = auVar77._4_4_;
            auVar89._4_4_ = fVar149 * fVar18;
            auVar89._0_4_ = fVar149 * fVar148;
            fVar28 = auVar77._8_4_;
            auVar89._8_4_ = fVar149 * fVar28;
            fVar38 = auVar77._12_4_;
            auVar89._12_4_ = fVar149 * fVar38;
            fVar48 = auVar77._16_4_;
            auVar89._16_4_ = fVar149 * fVar48;
            fVar58 = auVar77._20_4_;
            auVar89._20_4_ = fVar149 * fVar58;
            fVar68 = auVar77._24_4_;
            auVar89._24_4_ = fVar149 * fVar68;
            auVar89._28_4_ = uVar3;
            fVar156 = auVar76._0_4_;
            fVar19 = auVar76._4_4_;
            auVar90._4_4_ = fVar157 * fVar19;
            auVar90._0_4_ = fVar157 * fVar156;
            fVar29 = auVar76._8_4_;
            auVar90._8_4_ = fVar157 * fVar29;
            fVar39 = auVar76._12_4_;
            auVar90._12_4_ = fVar157 * fVar39;
            fVar49 = auVar76._16_4_;
            auVar90._16_4_ = fVar157 * fVar49;
            fVar59 = auVar76._20_4_;
            auVar90._20_4_ = fVar157 * fVar59;
            fVar69 = auVar76._24_4_;
            auVar90._24_4_ = fVar157 * fVar69;
            auVar90._28_4_ = uVar4;
            auVar76 = vsubps_avx(auVar90,auVar89);
            fVar158 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar10 = local_27a0._0_4_;
            fVar20 = local_27a0._4_4_;
            auVar91._4_4_ = fVar157 * fVar20;
            auVar91._0_4_ = fVar157 * fVar10;
            fVar30 = local_27a0._8_4_;
            auVar91._8_4_ = fVar157 * fVar30;
            fVar40 = local_27a0._12_4_;
            auVar91._12_4_ = fVar157 * fVar40;
            fVar50 = local_27a0._16_4_;
            auVar91._16_4_ = fVar157 * fVar50;
            fVar60 = local_27a0._20_4_;
            auVar91._20_4_ = fVar157 * fVar60;
            fVar70 = local_27a0._24_4_;
            auVar91._24_4_ = fVar157 * fVar70;
            auVar91._28_4_ = local_2800._28_4_;
            auVar92._4_4_ = fVar158 * fVar18;
            auVar92._0_4_ = fVar158 * fVar148;
            auVar92._8_4_ = fVar158 * fVar28;
            auVar92._12_4_ = fVar158 * fVar38;
            auVar92._16_4_ = fVar158 * fVar48;
            auVar92._20_4_ = fVar158 * fVar58;
            auVar92._24_4_ = fVar158 * fVar68;
            auVar92._28_4_ = auVar186._12_4_;
            auVar77 = vsubps_avx(auVar92,auVar91);
            auVar93._4_4_ = fVar158 * fVar19;
            auVar93._0_4_ = fVar158 * fVar156;
            auVar93._8_4_ = fVar158 * fVar29;
            auVar93._12_4_ = fVar158 * fVar39;
            auVar93._16_4_ = fVar158 * fVar49;
            auVar93._20_4_ = fVar158 * fVar59;
            auVar93._24_4_ = fVar158 * fVar69;
            auVar93._28_4_ = auVar186._12_4_;
            auVar94._4_4_ = fVar149 * fVar20;
            auVar94._0_4_ = fVar149 * fVar10;
            auVar94._8_4_ = fVar149 * fVar30;
            auVar94._12_4_ = fVar149 * fVar40;
            auVar94._16_4_ = fVar149 * fVar50;
            auVar94._20_4_ = fVar149 * fVar60;
            auVar94._24_4_ = fVar149 * fVar70;
            auVar94._28_4_ = local_27a0._28_4_;
            auVar78 = vsubps_avx(auVar94,auVar93);
            fVar11 = local_28e0._0_4_;
            fVar21 = local_28e0._4_4_;
            fVar31 = local_28e0._8_4_;
            fVar41 = local_28e0._12_4_;
            fVar51 = local_28e0._16_4_;
            fVar61 = local_28e0._20_4_;
            fVar71 = local_28e0._24_4_;
            fVar12 = auVar152._0_4_;
            fVar22 = auVar152._4_4_;
            fVar32 = auVar152._8_4_;
            fVar42 = auVar152._12_4_;
            fVar52 = auVar152._16_4_;
            fVar62 = auVar152._20_4_;
            fVar72 = auVar152._24_4_;
            auVar168 = ZEXT3264(local_2800);
            fVar13 = local_2800._0_4_;
            fVar23 = local_2800._4_4_;
            fVar33 = local_2800._8_4_;
            fVar43 = local_2800._12_4_;
            fVar53 = local_2800._16_4_;
            fVar63 = local_2800._20_4_;
            fVar73 = local_2800._24_4_;
            auVar155._0_4_ = fVar158 * fVar13 + fVar149 * fVar12 + fVar157 * fVar11;
            auVar155._4_4_ = fVar158 * fVar23 + fVar149 * fVar22 + fVar157 * fVar21;
            auVar155._8_4_ = fVar158 * fVar33 + fVar149 * fVar32 + fVar157 * fVar31;
            auVar155._12_4_ = fVar158 * fVar43 + fVar149 * fVar42 + fVar157 * fVar41;
            auVar155._16_4_ = fVar158 * fVar53 + fVar149 * fVar52 + fVar157 * fVar51;
            auVar155._20_4_ = fVar158 * fVar63 + fVar149 * fVar62 + fVar157 * fVar61;
            auVar155._24_4_ = fVar158 * fVar73 + fVar149 * fVar72 + fVar157 * fVar71;
            auVar155._28_4_ = fVar157 + fVar157 + local_27a0._28_4_;
            auVar142._8_4_ = 0x80000000;
            auVar142._0_8_ = 0x8000000080000000;
            auVar142._12_4_ = 0x80000000;
            auVar142._16_4_ = 0x80000000;
            auVar142._20_4_ = 0x80000000;
            auVar142._24_4_ = 0x80000000;
            auVar142._28_4_ = 0x80000000;
            auVar152 = vandps_avx(auVar155,auVar142);
            uVar125 = auVar152._0_4_;
            auVar180._0_4_ =
                 (float)(uVar125 ^
                        (uint)(fVar161 * auVar76._0_4_ +
                              fVar160 * auVar77._0_4_ + fVar159 * auVar78._0_4_));
            uVar198 = auVar152._4_4_;
            auVar180._4_4_ =
                 (float)(uVar198 ^
                        (uint)(fVar16 * auVar76._4_4_ +
                              fVar15 * auVar77._4_4_ + fVar14 * auVar78._4_4_));
            uVar113 = auVar152._8_4_;
            auVar180._8_4_ =
                 (float)(uVar113 ^
                        (uint)(fVar26 * auVar76._8_4_ +
                              fVar25 * auVar77._8_4_ + fVar24 * auVar78._8_4_));
            uVar199 = auVar152._12_4_;
            auVar180._12_4_ =
                 (float)(uVar199 ^
                        (uint)(fVar36 * auVar76._12_4_ +
                              fVar35 * auVar77._12_4_ + fVar34 * auVar78._12_4_));
            uVar200 = auVar152._16_4_;
            auVar180._16_4_ =
                 (float)(uVar200 ^
                        (uint)(fVar46 * auVar76._16_4_ +
                              fVar45 * auVar77._16_4_ + fVar44 * auVar78._16_4_));
            uVar201 = auVar152._20_4_;
            auVar180._20_4_ =
                 (float)(uVar201 ^
                        (uint)(fVar56 * auVar76._20_4_ +
                              fVar55 * auVar77._20_4_ + fVar54 * auVar78._20_4_));
            uVar202 = auVar152._24_4_;
            auVar180._24_4_ =
                 (float)(uVar202 ^
                        (uint)(fVar66 * auVar76._24_4_ +
                              fVar65 * auVar77._24_4_ + fVar64 * auVar78._24_4_));
            uVar203 = auVar152._28_4_;
            auVar180._28_4_ =
                 (float)(uVar203 ^ (uint)(auVar171._28_4_ + auVar74._28_4_ + auVar75._28_4_));
            auVar188._0_4_ =
                 (float)(uVar125 ^
                        (uint)(auVar76._0_4_ * fVar147 +
                              auVar77._0_4_ * fVar207 + fVar185 * auVar78._0_4_));
            auVar188._4_4_ =
                 (float)(uVar198 ^
                        (uint)(auVar76._4_4_ * fVar17 +
                              auVar77._4_4_ * fVar211 + fVar190 * auVar78._4_4_));
            auVar188._8_4_ =
                 (float)(uVar113 ^
                        (uint)(auVar76._8_4_ * fVar27 +
                              auVar77._8_4_ * fVar212 + fVar191 * auVar78._8_4_));
            auVar188._12_4_ =
                 (float)(uVar199 ^
                        (uint)(auVar76._12_4_ * fVar37 +
                              auVar77._12_4_ * fVar213 + fVar192 * auVar78._12_4_));
            auVar188._16_4_ =
                 (float)(uVar200 ^
                        (uint)(auVar76._16_4_ * fVar47 +
                              auVar77._16_4_ * fVar214 + fVar193 * auVar78._16_4_));
            auVar188._20_4_ =
                 (float)(uVar201 ^
                        (uint)(auVar76._20_4_ * fVar57 +
                              auVar77._20_4_ * fVar215 + fVar194 * auVar78._20_4_));
            auVar188._24_4_ =
                 (float)(uVar202 ^
                        (uint)(auVar76._24_4_ * fVar67 +
                              auVar77._24_4_ * fVar216 + fVar195 * auVar78._24_4_));
            auVar188._28_4_ = (float)(uVar203 ^ (uint)(auVar77._28_4_ + auVar78._28_4_ + -0.0));
            auVar171 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar152 = vcmpps_avx(auVar180,auVar171,5);
            auVar171 = vcmpps_avx(auVar188,auVar171,5);
            auVar152 = vandps_avx(auVar152,auVar171);
            auVar143._8_4_ = 0x7fffffff;
            auVar143._0_8_ = 0x7fffffff7fffffff;
            auVar143._12_4_ = 0x7fffffff;
            auVar143._16_4_ = 0x7fffffff;
            auVar143._20_4_ = 0x7fffffff;
            auVar143._24_4_ = 0x7fffffff;
            auVar143._28_4_ = 0x7fffffff;
            local_2600 = vandps_avx(auVar155,auVar143);
            auVar175 = ZEXT3264(local_2600);
            auVar171 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar155,4);
            auVar152 = vandps_avx(auVar152,auVar171);
            auVar144._0_4_ = auVar188._0_4_ + auVar180._0_4_;
            auVar144._4_4_ = auVar188._4_4_ + auVar180._4_4_;
            auVar144._8_4_ = auVar188._8_4_ + auVar180._8_4_;
            auVar144._12_4_ = auVar188._12_4_ + auVar180._12_4_;
            auVar144._16_4_ = auVar188._16_4_ + auVar180._16_4_;
            auVar144._20_4_ = auVar188._20_4_ + auVar180._20_4_;
            auVar144._24_4_ = auVar188._24_4_ + auVar180._24_4_;
            auVar144._28_4_ = auVar188._28_4_ + auVar180._28_4_;
            auVar74 = vcmpps_avx(auVar144,local_2600,2);
            auVar171 = vandps_avx(auVar152,auVar74);
            auVar75 = local_26a0 & auVar171;
            if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar75 >> 0x7f,0) != '\0') ||
                  (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar75 >> 0xbf,0) != '\0') ||
                (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar75[0x1f] < '\0') {
              auVar171 = vandps_avx(auVar171,local_26a0);
              local_2620._0_4_ =
                   (float)(uVar125 ^ (uint)(fVar13 * fVar10 + fVar12 * fVar156 + fVar148 * fVar11));
              local_2620._4_4_ =
                   (float)(uVar198 ^ (uint)(fVar23 * fVar20 + fVar22 * fVar19 + fVar18 * fVar21));
              local_2620._8_4_ =
                   (float)(uVar113 ^ (uint)(fVar33 * fVar30 + fVar32 * fVar29 + fVar28 * fVar31));
              local_2620._12_4_ =
                   (float)(uVar199 ^ (uint)(fVar43 * fVar40 + fVar42 * fVar39 + fVar38 * fVar41));
              local_2620._16_4_ =
                   (float)(uVar200 ^ (uint)(fVar53 * fVar50 + fVar52 * fVar49 + fVar48 * fVar51));
              local_2620._20_4_ =
                   (float)(uVar201 ^ (uint)(fVar63 * fVar60 + fVar62 * fVar59 + fVar58 * fVar61));
              local_2620._24_4_ =
                   (float)(uVar202 ^ (uint)(fVar73 * fVar70 + fVar72 * fVar69 + fVar68 * fVar71));
              local_2620._28_4_ =
                   uVar203 ^ (uint)(auVar74._28_4_ + auVar74._28_4_ + auVar152._28_4_);
              auVar179 = ZEXT3264(local_2620);
              fVar149 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar157 = local_2600._0_4_;
              fVar158 = local_2600._4_4_;
              auVar95._4_4_ = fVar158 * fVar149;
              auVar95._0_4_ = fVar157 * fVar149;
              fVar159 = local_2600._8_4_;
              auVar95._8_4_ = fVar159 * fVar149;
              fVar160 = local_2600._12_4_;
              auVar95._12_4_ = fVar160 * fVar149;
              fVar161 = local_2600._16_4_;
              auVar95._16_4_ = fVar161 * fVar149;
              fVar147 = local_2600._20_4_;
              auVar95._20_4_ = fVar147 * fVar149;
              fVar148 = local_2600._24_4_;
              auVar95._24_4_ = fVar148 * fVar149;
              auVar95._28_4_ = fVar149;
              auVar152 = vcmpps_avx(auVar95,local_2620,1);
              fVar149 = (ray->super_RayK<1>).tfar;
              auVar96._4_4_ = fVar158 * fVar149;
              auVar96._0_4_ = fVar157 * fVar149;
              auVar96._8_4_ = fVar159 * fVar149;
              auVar96._12_4_ = fVar160 * fVar149;
              auVar96._16_4_ = fVar161 * fVar149;
              auVar96._20_4_ = fVar147 * fVar149;
              auVar96._24_4_ = fVar148 * fVar149;
              auVar96._28_4_ = fVar149;
              auVar74 = vcmpps_avx(local_2620,auVar96,2);
              auVar152 = vandps_avx(auVar74,auVar152);
              auVar168 = ZEXT3264(auVar152);
              auVar74 = auVar171 & auVar152;
              if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar74 >> 0x7f,0) != '\0') ||
                    (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar74 >> 0xbf,0) != '\0') ||
                  (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar74[0x1f] < '\0') {
                auVar74 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                auVar146 = ZEXT3264(auVar74);
                auVar152 = vandps_avx(auVar171,auVar152);
                auVar171 = vsubps_avx(local_2600,auVar188);
                local_2660 = vblendvps_avx(auVar180,auVar171,local_24c0);
                local_25c0 = auVar152;
                auVar171 = vsubps_avx(local_2600,auVar180);
                local_2640 = vblendvps_avx(auVar188,auVar171,local_24c0);
                uStack_2524 = local_24c0._28_4_;
                local_2540[0] = fVar13 * (float)local_24e0._0_4_;
                local_2540[1] = fVar23 * (float)local_24e0._4_4_;
                local_2540[2] = fVar33 * fStack_24d8;
                local_2540[3] = fVar43 * fStack_24d4;
                fStack_2530 = fVar53 * fStack_24d0;
                fStack_252c = fVar63 * fStack_24cc;
                fStack_2528 = fVar73 * fStack_24c8;
                local_2520[0] = fVar12 * (float)local_24e0._0_4_;
                local_2520[1] = fVar22 * (float)local_24e0._4_4_;
                local_2520[2] = fVar32 * fStack_24d8;
                local_2520[3] = fVar42 * fStack_24d4;
                fStack_2510 = fVar52 * fStack_24d0;
                fStack_250c = fVar62 * fStack_24cc;
                fStack_2508 = fVar72 * fStack_24c8;
                uStack_2504 = uStack_2524;
                local_2500[0] = (float)local_24e0._0_4_ * fVar11;
                local_2500[1] = (float)local_24e0._4_4_ * fVar21;
                local_2500[2] = fStack_24d8 * fVar31;
                local_2500[3] = fStack_24d4 * fVar41;
                fStack_24f0 = fStack_24d0 * fVar51;
                fStack_24ec = fStack_24cc * fVar61;
                fStack_24e8 = fStack_24c8 * fVar71;
                uStack_24e4 = uStack_2524;
                local_2760 = auVar152;
                auVar171 = vrcpps_avx(local_2600);
                fVar149 = auVar171._0_4_;
                fVar156 = auVar171._4_4_;
                auVar97._4_4_ = fVar158 * fVar156;
                auVar97._0_4_ = fVar157 * fVar149;
                fVar157 = auVar171._8_4_;
                auVar97._8_4_ = fVar159 * fVar157;
                fVar158 = auVar171._12_4_;
                auVar97._12_4_ = fVar160 * fVar158;
                fVar159 = auVar171._16_4_;
                auVar97._16_4_ = fVar161 * fVar159;
                fVar160 = auVar171._20_4_;
                auVar97._20_4_ = fVar147 * fVar160;
                fVar161 = auVar171._24_4_;
                auVar97._24_4_ = fVar148 * fVar161;
                auVar97._28_4_ = local_2600._28_4_;
                auVar181._8_4_ = 0x3f800000;
                auVar181._0_8_ = 0x3f8000003f800000;
                auVar181._12_4_ = 0x3f800000;
                auVar181._16_4_ = 0x3f800000;
                auVar181._20_4_ = 0x3f800000;
                auVar181._24_4_ = 0x3f800000;
                auVar181._28_4_ = 0x3f800000;
                auVar171 = vsubps_avx(auVar181,auVar97);
                fVar149 = fVar149 + fVar149 * auVar171._0_4_;
                fVar156 = fVar156 + fVar156 * auVar171._4_4_;
                fVar157 = fVar157 + fVar157 * auVar171._8_4_;
                fVar158 = fVar158 + fVar158 * auVar171._12_4_;
                fVar159 = fVar159 + fVar159 * auVar171._16_4_;
                fVar160 = fVar160 + fVar160 * auVar171._20_4_;
                fVar161 = fVar161 + fVar161 * auVar171._24_4_;
                local_2560._4_4_ = fVar156 * local_2620._4_4_;
                local_2560._0_4_ = fVar149 * local_2620._0_4_;
                local_2560._8_4_ = fVar157 * local_2620._8_4_;
                local_2560._12_4_ = fVar158 * local_2620._12_4_;
                local_2560._16_4_ = fVar159 * local_2620._16_4_;
                local_2560._20_4_ = fVar160 * local_2620._20_4_;
                local_2560._24_4_ = fVar161 * local_2620._24_4_;
                local_2560._28_4_ = auVar171._28_4_;
                auVar175 = ZEXT3264(local_2560);
                local_25a0[0] = local_2660._0_4_ * fVar149;
                local_25a0[1] = local_2660._4_4_ * fVar156;
                local_25a0[2] = local_2660._8_4_ * fVar157;
                local_25a0[3] = local_2660._12_4_ * fVar158;
                fStack_2590 = local_2660._16_4_ * fVar159;
                fStack_258c = local_2660._20_4_ * fVar160;
                fStack_2588 = local_2660._24_4_ * fVar161;
                uStack_2584 = local_2660._28_4_;
                local_2580[0] = local_2640._0_4_ * fVar149;
                local_2580[1] = local_2640._4_4_ * fVar156;
                local_2580[2] = local_2640._8_4_ * fVar157;
                local_2580[3] = local_2640._12_4_ * fVar158;
                fStack_2570 = local_2640._16_4_ * fVar159;
                fStack_256c = local_2640._20_4_ * fVar160;
                fStack_2568 = local_2640._24_4_ * fVar161;
                uStack_2564 = local_2660._28_4_;
                auVar135._8_4_ = 0x7f800000;
                auVar135._0_8_ = 0x7f8000007f800000;
                auVar135._12_4_ = 0x7f800000;
                auVar135._16_4_ = 0x7f800000;
                auVar135._20_4_ = 0x7f800000;
                auVar135._24_4_ = 0x7f800000;
                auVar135._28_4_ = 0x7f800000;
                auVar171 = vblendvps_avx(auVar135,local_2560,auVar152);
                auVar75 = vshufps_avx(auVar171,auVar171,0xb1);
                auVar75 = vminps_avx(auVar171,auVar75);
                auVar76 = vshufpd_avx(auVar75,auVar75,5);
                auVar75 = vminps_avx(auVar75,auVar76);
                auVar76 = vperm2f128_avx(auVar75,auVar75,1);
                auVar75 = vminps_avx(auVar75,auVar76);
                auVar171 = vcmpps_avx(auVar171,auVar75,0);
                auVar75 = auVar152 & auVar171;
                if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar75 >> 0x7f,0) != '\0') ||
                      (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar75 >> 0xbf,0) != '\0') ||
                    (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar75[0x1f] < '\0') {
                  auVar152 = vandps_avx(auVar171,auVar152);
                }
                uVar125 = vextractps_avx(auVar74._0_16_,1);
                uVar113 = vmovmskps_avx(auVar152);
                uVar198 = 0;
                _local_28a0 = auVar98;
                _local_2890 = auVar99;
                _local_2740 = auVar100;
                _local_2730 = auVar101;
                _local_2720 = auVar102;
                _local_2710 = auVar103;
                _local_2700 = auVar104;
                _local_26f0 = auVar105;
                _local_26e0 = auVar106;
                _local_26d0 = auVar107;
                _local_26c0 = auVar108;
                if (uVar113 != 0) {
                  for (; (uVar113 >> uVar198 & 1) == 0; uVar198 = uVar198 + 1) {
                  }
                }
LAB_014da4d3:
                auVar168 = ZEXT3264(auVar152);
                uVar121 = CONCAT44(0,uVar198);
                local_27b8 = *(uint *)((long)&local_23c0 + uVar121 * 4);
                pGVar7 = (local_28e8->geometries).items[local_27b8].ptr;
                if ((pGVar7->mask & uVar125) == 0) {
                  *(undefined4 *)(local_2760 + uVar121 * 4) = 0;
                }
                else {
                  local_28e0 = auVar146._0_32_;
                  local_2800 = auVar175._0_32_;
                  if (local_28f0->args->filter == (RTCFilterFunctionN)0x0) {
                    local_2830.context = local_28f0->user;
                    if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                      fVar149 = local_25a0[uVar121];
                      fVar157 = local_2580[uVar121];
                      (ray->super_RayK<1>).tfar = local_2540[uVar121 - 8];
                      (ray->Ng).field_0.field_0.x = local_2540[uVar121];
                      (ray->Ng).field_0.field_0.y = local_2520[uVar121];
                      (ray->Ng).field_0.field_0.z = local_2500[uVar121];
                      ray->u = fVar149;
                      ray->v = fVar157;
                      ray->primID = *(uint *)((long)&local_2680 + uVar121 * 4);
                      ray->geomID = local_27b8;
                      ray->instID[0] = (local_2830.context)->instID[0];
                      ray->instPrimID[0] = (local_2830.context)->instPrimID[0];
                      goto LAB_014da34d;
                    }
                  }
                  else {
                    local_2830.context = local_28f0->user;
                  }
                  local_28c0._0_8_ = local_28f0->args;
                  local_27cc = local_2520[uVar121];
                  auVar168 = ZEXT464((uint)local_27cc);
                  local_27d0 = local_2540[uVar121];
                  local_27c8 = local_2500[uVar121];
                  local_27c4 = local_25a0[uVar121];
                  local_27c0 = local_2580[uVar121];
                  local_27bc = *(undefined4 *)((long)&local_2680 + uVar121 * 4);
                  local_27b4 = (local_2830.context)->instID[0];
                  local_27b0 = (local_2830.context)->instPrimID[0];
                  local_2780._0_8_ = uVar121;
                  (ray->super_RayK<1>).tfar = local_2540[uVar121 - 8];
                  local_28f4 = -1;
                  local_2830.valid = &local_28f4;
                  local_2830.geometryUserPtr = pGVar7->userPtr;
                  local_2830.ray = (RTCRayN *)ray;
                  local_2830.hit = (RTCHitN *)&local_27d0;
                  local_2830.N = 1;
                  local_27a0._0_8_ = pGVar7;
                  if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_014da6c9:
                    if ((*(code **)(local_28c0._0_8_ + 0x10) != (code *)0x0) &&
                       (((*(byte *)local_28c0._0_8_ & 2) != 0 ||
                        ((*(byte *)(local_27a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                      auVar168 = ZEXT1664(auVar168._0_16_);
                      auVar179 = ZEXT1664(auVar179._0_16_);
                      (**(code **)(local_28c0._0_8_ + 0x10))(&local_2830);
                      if (*local_2830.valid == 0) goto LAB_014da764;
                    }
                    (((Vec3f *)((long)local_2830.ray + 0x30))->field_0).field_0.x =
                         *(float *)local_2830.hit;
                    (((Vec3f *)((long)local_2830.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_2830.hit + 4);
                    (((Vec3f *)((long)local_2830.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_2830.hit + 8);
                    *(float *)((long)local_2830.ray + 0x3c) = *(float *)(local_2830.hit + 0xc);
                    *(float *)((long)local_2830.ray + 0x40) = *(float *)(local_2830.hit + 0x10);
                    *(float *)((long)local_2830.ray + 0x44) = *(float *)(local_2830.hit + 0x14);
                    *(float *)((long)local_2830.ray + 0x48) = *(float *)(local_2830.hit + 0x18);
                    *(float *)((long)local_2830.ray + 0x4c) = *(float *)(local_2830.hit + 0x1c);
                    *(float *)((long)local_2830.ray + 0x50) = *(float *)(local_2830.hit + 0x20);
                  }
                  else {
                    auVar168 = ZEXT464((uint)local_27cc);
                    auVar179 = ZEXT1664(auVar179._0_16_);
                    (*pGVar7->intersectionFilterN)(&local_2830);
                    if (*local_2830.valid != 0) goto LAB_014da6c9;
LAB_014da764:
                    (ray->super_RayK<1>).tfar = (float)local_28e0._0_4_;
                  }
                  fVar149 = (ray->super_RayK<1>).tfar;
                  auVar136._4_4_ = fVar149;
                  auVar136._0_4_ = fVar149;
                  auVar136._8_4_ = fVar149;
                  auVar136._12_4_ = fVar149;
                  auVar136._16_4_ = fVar149;
                  auVar136._20_4_ = fVar149;
                  auVar136._24_4_ = fVar149;
                  auVar136._28_4_ = fVar149;
                  *(undefined4 *)(local_2760 + local_2780._0_8_ * 4) = 0;
                  auVar175 = ZEXT3264(local_2800);
                  auVar152 = vcmpps_avx(local_2800,auVar136,2);
                  local_2760 = vandps_avx(auVar152,local_2760);
                  uVar125 = (ray->super_RayK<1>).mask;
                  auVar146 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
                }
                if ((((((((local_2760 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_2760 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_2760 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_2760 >> 0x7f,0) == '\0') &&
                      (local_2760 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_2760 >> 0xbf,0) == '\0') &&
                    (local_2760 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_2760[0x1f]) goto LAB_014da34d;
                auVar145._8_4_ = 0x7f800000;
                auVar145._0_8_ = 0x7f8000007f800000;
                auVar145._12_4_ = 0x7f800000;
                auVar145._16_4_ = 0x7f800000;
                auVar145._20_4_ = 0x7f800000;
                auVar145._24_4_ = 0x7f800000;
                auVar145._28_4_ = 0x7f800000;
                auVar171 = vblendvps_avx(auVar145,auVar175._0_32_,local_2760);
                auVar152 = vshufps_avx(auVar171,auVar171,0xb1);
                auVar152 = vminps_avx(auVar171,auVar152);
                auVar74 = vshufpd_avx(auVar152,auVar152,5);
                auVar74 = vminps_avx(auVar152,auVar74);
                auVar152 = vperm2f128_avx(auVar74,auVar74,1);
                auVar74 = vminps_avx(auVar74,auVar152);
                auVar74 = vcmpps_avx(auVar171,auVar74,0);
                auVar75 = local_2760 & auVar74;
                auVar171 = local_2760;
                if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar75 >> 0x7f,0) != '\0') ||
                      (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar75 >> 0xbf,0) != '\0') ||
                    (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar75[0x1f] < '\0') {
                  auVar171 = vandps_avx(auVar74,local_2760);
                }
                uVar113 = vmovmskps_avx(auVar171);
                uVar198 = 0;
                if (uVar113 != 0) {
                  for (; (uVar113 >> uVar198 & 1) == 0; uVar198 = uVar198 + 1) {
                  }
                }
                goto LAB_014da4d3;
              }
            }
LAB_014da34d:
            lVar111 = lVar111 + 1;
          } while (lVar111 != local_2878);
        }
        fVar149 = (ray->super_RayK<1>).tfar;
        auVar137 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar149,CONCAT420(fVar149,CONCAT416(fVar149,
                                                  CONCAT412(fVar149,CONCAT48(fVar149,CONCAT44(
                                                  fVar149,fVar149))))))));
        auVar146 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar184 = ZEXT3264(local_23e0);
        auVar189 = ZEXT3264(local_2400);
        auVar197 = ZEXT3264(local_2420);
        auVar205 = ZEXT3264(local_2440);
        auVar206 = ZEXT3264(local_2460);
        auVar210 = ZEXT3264(local_2480);
        auVar182 = ZEXT3264(local_24a0);
        uVar121 = local_2880;
      }
    } while (pauVar109 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }